

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

void TTA::UpdateTable(uint u,uint v)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  puVar2 = next_;
  puVar1 = rtable_;
  if (u < v) {
    uVar4 = v;
    uVar3 = u;
    uVar5 = v;
    if (v != 0xffffffff) {
      do {
        puVar1[uVar4] = u;
        uVar4 = puVar2[uVar4];
      } while (uVar4 != 0xffffffff);
    }
  }
  else {
    if (u <= v) {
      return;
    }
    uVar3 = v;
    uVar5 = u;
    uVar4 = u;
    if (u != 0xffffffff) {
      do {
        puVar1[uVar4] = v;
        uVar4 = puVar2[uVar4];
      } while (uVar4 != 0xffffffff);
    }
  }
  puVar1 = tail_;
  next_[tail_[uVar3]] = uVar5;
  puVar1[uVar3] = puVar1[uVar5];
  return;
}

Assistant:

static void UpdateTable(unsigned u, unsigned v)
    {
        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                rtable_[i] = u;
                i = next_[i];
            }
            next_[tail_[u]] = v;
            tail_[u] = tail_[v];
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                rtable_[i] = v;
                i = next_[i];
            }
            next_[tail_[v]] = u;
            tail_[v] = tail_[u];
        }
    }